

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType from,IntegerType to)

{
  IntegerType type;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  IntegerType local_18;
  undefined4 local_14;
  IntegerType to_local;
  IntegerType from_local;
  
  local_14 = SUB84(this,0);
  local_18 = from;
  _to_local = __return_storage_ptr__;
  getTypeName_abi_cxx11_(&local_58,(SpirVAssembly *)((ulong)this & 0xffffffff),from);
  std::operator+(&local_38,&local_58,"_to_");
  getTypeName_abi_cxx11_(&local_88,(SpirVAssembly *)(ulong)local_18,type);
  std::operator+(__return_storage_ptr__,&local_38,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

const string getTestName (IntegerType from, IntegerType to)
{
	return getTypeName(from) + "_to_" + getTypeName(to);
}